

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Choice(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  int *piVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Cec_ParChc_t Pars;
  
  Cec_ManChcSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Ccvh"), iVar3 = globalUtilOptind, iVar1 != 0x43) {
      piVar2 = &Pars.fUseCSat;
      if (iVar1 != 99) {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            if (pAbc->pGia != (Gia_Man_t *)0x0) {
              pNew = Cec_ManChoiceComputation(pAbc->pGia,&Pars);
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Choice(): There is no AIG.\n";
            iVar3 = -1;
            goto LAB_0020f7d5;
          }
          goto LAB_0020f74f;
        }
        piVar2 = &Pars.fVerbose;
      }
      *(byte *)piVar2 = (byte)*piVar2 ^ 1;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    Pars.nBTLimit = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
  } while (-1 < Pars.nBTLimit);
LAB_0020f74f:
  iVar3 = -2;
  Abc_Print(-2,"usage: &choice [-C num] [-cvh]\n");
  Abc_Print(-2,"\t         performs computation of structural choices\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)Pars.nBTLimit);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (Pars.fUseCSat == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar4);
  if (Pars.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
LAB_0020f7d5:
  Abc_Print(iVar3,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Choice( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParChc_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManChcSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ccvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Choice(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Cec_ManChoiceComputation( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &choice [-C num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs computation of structural choices\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}